

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void testing::internal::TuplePrefixPrinter<1ul>::PrintPrefixTo<std::tuple<gurkenlaeufer::Scenario>>
               (tuple<gurkenlaeufer::Scenario> *t,ostream *os)

{
  type *value;
  ostream *os_local;
  tuple<gurkenlaeufer::Scenario> *t_local;
  
  TuplePrefixPrinter<0ul>::PrintPrefixTo<std::tuple<gurkenlaeufer::Scenario>>(t,os);
  value = TuplePolicy<std::tuple<gurkenlaeufer::Scenario>>::get<0ul>(t);
  UniversalPrinter<gurkenlaeufer::Scenario>::Print(value,os);
  return;
}

Assistant:

static void PrintPrefixTo(const Tuple& t, ::std::ostream* os) {
    TuplePrefixPrinter<N - 1>::PrintPrefixTo(t, os);
    GTEST_INTENTIONAL_CONST_COND_PUSH_()
    if (N > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
      *os << ", ";
    }
    UniversalPrinter<
        typename TuplePolicy<Tuple>::template tuple_element<N - 1>::type>
        ::Print(TuplePolicy<Tuple>::template get<N - 1>(t), os);
  }